

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2-impl.h
# Opt level: O0

void store32(void *dst,uint32_t w)

{
  uint8_t *p;
  uint32_t w_local;
  void *dst_local;
  
  *(char *)dst = (char)w;
  *(char *)((long)dst + 1) = (char)(w >> 8);
  *(char *)((long)dst + 2) = (char)(w >> 0x10);
  *(char *)((long)dst + 3) = (char)(w >> 0x18);
  return;
}

Assistant:

static void store32( void *dst, uint32_t w )
{
#if defined(NATIVE_LITTLE_ENDIAN)
  *( uint32_t * )( dst ) = w;
#else
  uint8_t *p = ( uint8_t * )dst;
  *p++ = ( uint8_t )w; w >>= 8;
  *p++ = ( uint8_t )w; w >>= 8;
  *p++ = ( uint8_t )w; w >>= 8;
  *p++ = ( uint8_t )w;
#endif
}